

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

intptr_t mock_(TestReporter *test_reporter,char *function,char *mock_file,int mock_line,
              char *parameters,...)

{
  CgreenValue actual_00;
  CgreenValue actual_01;
  char in_AL;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  RecordedExpectation *expectation_00;
  CgreenVector *vector;
  int *piVar4;
  undefined8 *puVar5;
  Constraint *constraint_00;
  undefined4 in_ECX;
  _func_char_ptr_Constraint_ptr_char_ptr_intptr_t *in_RDX;
  char *in_RSI;
  char *in_RDI;
  _func__Bool_Constraint_ptr_CgreenValue *in_R8;
  char *in_R9;
  undefined8 in_XMM0_Qa;
  __va_list_tag *in_XMM0_Qb;
  Constraint *constraint_1;
  int i_3;
  CgreenValue actual_1;
  char *parameter_name_1;
  int i_2;
  CgreenValue actual;
  char *parameter_name;
  int i_1;
  Constraint *constraint;
  int i;
  RecordedExpectation *expectation;
  CgreenValue stored_result;
  int failures_after_read_only_constraints_executed;
  int failures_before_read_only_constraints_executed;
  CgreenVector *parameter_names;
  CgreenVector *actual_values;
  va_list actuals;
  RecordedExpectation *in_stack_fffffffffffffe18;
  TestReporter *in_stack_fffffffffffffe20;
  TestReporter *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int iVar6;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Constraint *constraint_01;
  RecordedExpectation *in_stack_fffffffffffffe48;
  TestReporter *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  RecordedExpectation *in_stack_fffffffffffffe60;
  CgreenVector *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  __va_list_tag *in_stack_fffffffffffffe80;
  int local_fc;
  int local_d4;
  int local_ac;
  int local_9c;
  int local_98;
  intptr_t local_90;
  ConstraintType local_48;
  undefined4 local_44;
  char *local_40;
  _func_void_Constraint_ptr *local_38;
  _func__Bool_Constraint_ptr_CgreenValue *local_30;
  undefined4 local_24;
  _func_char_ptr_Constraint_ptr_char_ptr_intptr_t *local_20;
  char *local_18;
  char *local_10;
  intptr_t local_8;
  
  if (in_AL != '\0') {
    in_stack_fffffffffffffe78 = (undefined4)in_XMM0_Qa;
    in_stack_fffffffffffffe7c = (int)((ulong)in_XMM0_Qa >> 0x20);
    in_stack_fffffffffffffe80 = in_XMM0_Qb;
  }
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  expectation_00 = find_expectation((char *)in_stack_fffffffffffffe28);
  vector = create_vector_of_names((char *)in_stack_fffffffffffffe68);
  local_38 = (_func_void_Constraint_ptr *)&stack0xfffffffffffffe48;
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x28;
  constraint_01 = (Constraint *)&stack0xffffffffffffffb8;
  number_of_parameters_in((char *)in_stack_fffffffffffffe28);
  create_vector_of_actuals(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  convert_boxed_doubles_to_cgreen_values(in_R9,in_stack_fffffffffffffe68);
  if (expectation_00 == (RecordedExpectation *)0x0) {
    handle_missing_expectation_for
              ((char *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
               (int)((ulong)constraint_01 >> 0x20),
               (CgreenVector *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (CgreenVector *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
    destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
    local_8 = 0;
  }
  else {
    _Var1 = is_never_call(expectation_00);
    if (_Var1) {
      expectation_00->times_triggered = expectation_00->times_triggered + 1;
      report_violated_never_call(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
      destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
      local_8 = 0;
    }
    else {
      ensure_successfully_mocked_calls_list_exists();
      cgreen_vector_add((CgreenVector *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      stored_result_or_default_for((CgreenVector *)constraint_01);
      local_9c = 0;
      while (iVar6 = local_9c, iVar2 = cgreen_vector_size(expectation_00->constraints),
            iVar6 < iVar2) {
        piVar4 = (int *)cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0);
        if (*piVar4 == 8) {
          expectation_00->number_times_called = expectation_00->number_times_called + 1;
        }
        else {
          _Var1 = is_parameter((Constraint *)in_stack_fffffffffffffe20);
          if ((_Var1) &&
             (_Var1 = constraint_is_for_parameter_in
                                ((Constraint *)CONCAT44(iVar6,in_stack_fffffffffffffe38),
                                 (char *)CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30)), !_Var1)) {
            report_mock_parameter_name_not_found
                      ((TestReporter *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                       ,(RecordedExpectation *)in_stack_fffffffffffffe28,
                       (char *)in_stack_fffffffffffffe20);
            destroy_expectation_if_time_to_die((RecordedExpectation *)0x10c7e2);
            destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
            destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
            return local_90;
          }
        }
        local_9c = local_9c + 1;
      }
      iVar6 = *(int *)(local_10 + 0x54);
      local_ac = 0;
      while (iVar2 = local_ac, iVar3 = cgreen_vector_size(vector), iVar2 < iVar3) {
        cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0);
        puVar5 = (undefined8 *)cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0);
        in_stack_fffffffffffffe18 = (RecordedExpectation *)*puVar5;
        in_stack_fffffffffffffe20 = (TestReporter *)puVar5[1];
        actual_00.value.integer_value._0_4_ = in_stack_fffffffffffffe78;
        actual_00._0_8_ = in_R9;
        actual_00.value.integer_value._4_4_ = in_stack_fffffffffffffe7c;
        actual_00.value_size = (size_t)in_stack_fffffffffffffe80;
        apply_any_read_only_parameter_constraints
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,actual_00,
                   in_stack_fffffffffffffe50);
        local_ac = local_ac + 1;
      }
      if (iVar6 == *(int *)(local_10 + 0x54)) {
        local_d4 = 0;
        while (iVar6 = local_d4, iVar2 = cgreen_vector_size(vector), iVar6 < iVar2) {
          cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0);
          puVar5 = (undefined8 *)cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0);
          in_stack_fffffffffffffe18 = (RecordedExpectation *)*puVar5;
          in_stack_fffffffffffffe20 = (TestReporter *)puVar5[1];
          actual_01.value.integer_value._0_4_ = in_stack_fffffffffffffe78;
          actual_01._0_8_ = in_R9;
          actual_01.value.integer_value._4_4_ = in_stack_fffffffffffffe7c;
          actual_01.value_size = (size_t)in_stack_fffffffffffffe80;
          apply_any_content_setting_parameter_constraints
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,actual_01,
                     in_stack_fffffffffffffe50);
          local_d4 = local_d4 + 1;
        }
      }
      local_fc = 0;
      while (iVar6 = local_fc, iVar2 = cgreen_vector_size(expectation_00->constraints),
            iVar6 < iVar2) {
        constraint_00 = (Constraint *)cgreen_vector_get((CgreenVector *)in_stack_fffffffffffffe18,0)
        ;
        _Var1 = is_side_effect_constraint(constraint_00);
        if (_Var1) {
          apply_side_effect(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,constraint_01);
        }
        local_fc = local_fc + 1;
      }
      destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
      destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffe20);
      expectation_00->times_triggered = expectation_00->times_triggered + 1;
      destroy_expectation_if_time_to_die((RecordedExpectation *)0x10cae6);
      if (local_98 == 2) {
        local_8 = box_double((double)in_stack_fffffffffffffe20);
      }
      else {
        local_8 = local_90;
      }
    }
  }
  return local_8;
}

Assistant:

intptr_t mock_(TestReporter* test_reporter, const char *function, const char *mock_file, int mock_line, const char *parameters, ...) {
    va_list actuals;
    CgreenVector *actual_values;
    CgreenVector *parameter_names;
    int failures_before_read_only_constraints_executed;
    int failures_after_read_only_constraints_executed;
    CgreenValue stored_result;
    RecordedExpectation *expectation = find_expectation(function);

    parameter_names = create_vector_of_names(parameters);

    va_start(actuals, parameters);
    actual_values = create_vector_of_actuals(actuals, number_of_parameters_in(parameters));
    va_end(actuals);

    convert_boxed_doubles_to_cgreen_values(parameters, actual_values);

    if (expectation == NULL) {
        handle_missing_expectation_for(function, mock_file, mock_line, parameter_names, actual_values, test_reporter);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    if (is_never_call(expectation)) {
        expectation->times_triggered++;
        report_violated_never_call(test_reporter, expectation);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    ensure_successfully_mocked_calls_list_exists();
    cgreen_vector_add(successfully_mocked_calls, (void*)function);

    stored_result = stored_result_or_default_for(expectation->constraints);
    // FIXME: Should verify that return value is not a DOUBLE as `mock_()' can not
    // return them. There should also be a 'mock_double_()' which does the same except
    // returning a double.

    // First check all actual constraints for validity...
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->number_times_called++;
            continue;
        }

        if (!is_parameter(constraint))
            continue;

        if (!constraint_is_for_parameter_in(constraint, parameters)) {
            // if expectation parameter name isn't in parameter_names,
            // fail test and skip applying constraints unlikely to match
            report_mock_parameter_name_not_found(test_reporter, expectation, constraint->parameter_name);
            destroy_expectation_if_time_to_die(expectation);
            destroy_cgreen_vector(actual_values);
            destroy_cgreen_vector(parameter_names);

            return stored_result.value.integer_value;
        }
    }

    // Now we can do the read-only constraints.  If read-only
    // constraints aren't matching, content-setting ones might corrupt
    // memory so apply read-only ones first, and if they don't fail,
    // then do the deeper constraints
    failures_before_read_only_constraints_executed = test_reporter->failures;

    for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
        const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
        CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
        apply_any_read_only_parameter_constraints(expectation, parameter_name, actual, test_reporter);
    }

    failures_after_read_only_constraints_executed = test_reporter->failures;

    // And now we can do the content setting constraints...
    // FIXME: this comparison doesn't work because only parent
    //        processes' pass/fail counts are updated, and even then
    //        only once they read from the pipe
    if (failures_before_read_only_constraints_executed == failures_after_read_only_constraints_executed) {
        for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
            const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
            CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
            apply_any_content_setting_parameter_constraints(expectation, parameter_name, actual, test_reporter);
        }
    }

    // And finally run all side effects
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (is_side_effect_constraint(constraint)) {
            apply_side_effect(test_reporter, expectation, constraint);
            continue;
        }
    }



    destroy_cgreen_vector(parameter_names);
    destroy_cgreen_vector(actual_values);

    expectation->times_triggered++;
    destroy_expectation_if_time_to_die(expectation);

    if (stored_result.type == CGREEN_DOUBLE) {
#ifdef FUTURE
        /* TODO: for some future version we should ensure that the
           user is not trying to return a double through 'mock()' when
           there is a 'mock_double()' available, which there isn't
           yet. So then

               return unbox_double(mock(...));

           should be replaced by

               return mock_double(...);
        */
        test_reporter->assert_true(test_reporter,
                                   mock_file,
                                   mock_line,
                                   false,
                                   "Mocked function [%s] have a 'will_return_double()' expectation, "
                                   "but 'mock()' cannot return doubles; Use 'mock_double()' instead",
                                   function);
        /* But we'll return it anyway, whatever it becomes is what he will get... */
        return stored_result.value.double_value;
#else
        /* ... but for now return a boxed double since the user is probably using

               return unbox_double(mock(...));

           as is the standard way in 1.x
        */
        return box_double(stored_result.value.double_value);
#endif
    } else
        return stored_result.value.integer_value;
}